

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.h
# Opt level: O0

Vec3 cert::trace(Ray *r,World *world,int depth)

{
  Vec3 VVar1;
  Vec3 point;
  cert *__return_storage_ptr__;
  float t_max;
  Vec3 VVar2;
  undefined8 local_278;
  float local_270;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  Vec3 local_228;
  Vec3 local_218;
  Vec3 local_208;
  Vec3 local_1f8;
  undefined8 local_1e8;
  float local_1e0;
  Vec3 local_1d8;
  Vec3 local_1c8;
  Vec3 local_1b8;
  Vec3 local_1a8;
  Vec3 local_198;
  undefined1 local_188 [8];
  Vec3 refract_contrib;
  float fStack_174;
  float local_170;
  undefined1 local_168 [8];
  Vec3 reflect_contrib;
  float local_150;
  byte local_104 [4];
  undefined1 local_100 [4];
  ScatterOut out;
  float local_b8;
  undefined1 local_70 [8];
  Vec3 light_contribution;
  HitRecord rec;
  int depth_local;
  World *world_local;
  Ray *r_local;
  undefined4 uStack_10;
  float local_c;
  
  t_max = std::numeric_limits<float>::max();
  __return_storage_ptr__ = (cert *)&light_contribution.z;
  World::hit((HitRecord *)__return_storage_ptr__,world,r,0.001,t_max);
  if ((light_contribution.z._0_1_ & 1) == 0) {
    VVar2 = background_color(__return_storage_ptr__,r->direction);
    local_278 = VVar2._0_8_;
    stack0xffffffffffffffec = local_278;
    local_270 = VVar2.z;
    local_c = local_270;
  }
  else if (depth < 6) {
    point.z = rec.p.x;
    point._0_8_ = rec._0_8_;
    VVar2.z = rec.normal.x;
    VVar2._0_8_ = rec.p._4_8_;
    VVar2 = World::light_hit(world,point,VVar2);
    local_b8 = VVar2.z;
    light_contribution.x = local_b8;
    out.refracted.direction._4_8_ = VVar2._0_8_;
    local_70._0_4_ = out.refracted.direction.y;
    local_70._4_4_ = out.refracted.direction.z;
    unique0x1000030b = VVar2;
    (**(code **)(*(long *)rec.normal._4_8_ + 0x10))
              (rec._0_8_,rec.p.x,rec.p._4_8_,rec.normal.x,rec.mat,local_104,rec.normal._4_8_,r,world
              );
    if (out.scattered.direction.y < 0.0) {
      if ((local_104[0] & 1) == 0) {
        VVar2 = operator*((Vec3 *)local_70,(Vec3 *)local_100);
        local_248 = VVar2._0_8_;
        stack0xffffffffffffffec = local_248;
        local_240 = VVar2.z;
        local_c = local_240;
      }
      else {
        VVar2 = operator*((Vec3 *)local_70,(Vec3 *)local_100);
        local_208.z = VVar2.z;
        local_1f8.z = local_208.z;
        local_208._0_8_ = VVar2._0_8_;
        local_1f8.x = local_208.x;
        local_1f8.y = local_208.y;
        local_208 = VVar2;
        VVar2 = trace((Ray *)&out.attenuation.y,world,depth + 1);
        local_228.z = VVar2.z;
        local_218.z = local_228.z;
        local_228._0_8_ = VVar2._0_8_;
        local_218.x = local_228.x;
        local_218.y = local_228.y;
        VVar2 = operator*(&local_1f8,&local_218);
        local_238 = VVar2._0_8_;
        stack0xffffffffffffffec = local_238;
        local_230 = VVar2.z;
        local_c = local_230;
      }
    }
    else if (out.scattered.direction.y < 1.0) {
      VVar2 = trace((Ray *)&out.attenuation.y,world,depth + 1);
      local_170 = VVar2.z;
      reflect_contrib.x = local_170;
      stack0xfffffffffffffe88 = VVar2._0_8_;
      local_168._0_4_ = refract_contrib.z;
      local_168._4_4_ = fStack_174;
      unique0x100002ff = VVar2;
      VVar2 = trace((Ray *)&out.scattered.direction.z,world,depth + 1);
      local_198.z = VVar2.z;
      refract_contrib.x = local_198.z;
      local_198._0_8_ = VVar2._0_8_;
      local_188._0_4_ = local_198.x;
      local_188._4_4_ = local_198.y;
      local_198 = VVar2;
      VVar2 = operator*(out.scattered.direction.y,(Vec3 *)local_168);
      local_1b8.z = VVar2.z;
      local_1a8.z = local_1b8.z;
      local_1b8._0_8_ = VVar2._0_8_;
      local_1a8.x = local_1b8.x;
      local_1a8.y = local_1b8.y;
      local_1b8 = VVar2;
      VVar2 = operator*(1.0 - out.scattered.direction.y,(Vec3 *)local_188);
      local_1d8.z = VVar2.z;
      local_1c8.z = local_1d8.z;
      local_1d8._0_8_ = VVar2._0_8_;
      local_1c8.x = local_1d8.x;
      local_1c8.y = local_1d8.y;
      local_1d8 = VVar2;
      VVar2 = operator+(&local_1a8,&local_1c8);
      local_1e8 = VVar2._0_8_;
      stack0xffffffffffffffec = local_1e8;
      local_1e0 = VVar2.z;
      local_c = local_1e0;
    }
    else {
      VVar2 = trace((Ray *)&out.scattered.direction.z,world,depth + 1);
      stack0xfffffffffffffea8 = VVar2._0_8_;
      stack0xffffffffffffffec = stack0xfffffffffffffea8;
      local_150 = VVar2.z;
      local_c = local_150;
    }
  }
  else {
    stack0xffffffffffffffec = 0;
    local_c = 0.0;
  }
  VVar1.z = local_c;
  VVar1.x = (float)r_local._4_4_;
  VVar1.y = (float)uStack_10;
  return VVar1;
}

Assistant:

constexpr Vec3 trace (const Ray& r, World& world, int depth)
{
	HitRecord rec = world.hit (r, 0.001, std::numeric_limits<float>::max ());
	if (rec.hit)
	{
		if (depth > max_bounces) return VEC3_ZERO;

		auto light_contribution = world.light_hit (rec.p, rec.normal);

		ScatterOut out = rec.mat->scatter (rec.p, rec.normal, rec.uv, r, world.random);
		if (out.index >= 0.0f)
		{
			if (out.index >= 1.0f)
			{
				return trace (out.refracted, world, depth + 1);
			}
			else
			{
				Vec3 reflect_contrib = trace (out.scattered, world, depth + 1);
				Vec3 refract_contrib = trace (out.refracted, world, depth + 1);
				return out.index * reflect_contrib + (1.0 - out.index) * refract_contrib;
			}
		}
		else if (out.is_scattered)
		{
			return light_contribution * out.attenuation * trace (out.scattered, world, depth + 1);
		}
		else
		{
			return light_contribution * out.attenuation;
		}
	}
	else
	{
		return background_color (r.direction);
	}
}